

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL> __thiscall
slang::parsing::Parser::parseClassSpecifierList(Parser *this,bool allowSpecifiers)

{
  long lVar1;
  pointer ppCVar2;
  bool bVar3;
  Diagnostic *pDVar4;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  long lVar5;
  SourceRange SVar6;
  string_view sVar7;
  span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL> sVar8;
  Token ok;
  Token sk;
  ClassSpecifierSyntax *specifier;
  SmallVector<slang::syntax::ClassSpecifierSyntax_*,_5UL> specifiers;
  Token local_a8;
  Token local_98;
  ulong local_80;
  ClassSpecifierSyntax *local_78;
  SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*> local_70 [2];
  
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  local_80 = 0;
  while( true ) {
    bVar3 = ParserBase::peek(&this->super_ParserBase,Colon);
    if (!bVar3) break;
    local_78 = parseClassSpecifier(this);
    if (((local_78->keyword).field_0x2 & 1) == 0) {
      if (local_70[0].len == 0 && !allowSpecifiers) {
        SVar6 = slang::syntax::SyntaxNode::sourceRange(&local_78->super_SyntaxNode);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xa30005,SVar6);
      }
      ppCVar2 = local_70[0].data_;
      if (local_70[0].len != 0) {
        lVar1 = local_70[0].len * 8;
        lVar5 = 0;
        do {
          local_98.kind = (local_78->keyword).kind;
          local_98._2_1_ = (local_78->keyword).field_0x2;
          local_98.numFlags.raw = (local_78->keyword).numFlags.raw;
          local_98.rawLen = (local_78->keyword).rawLen;
          local_98.info = (local_78->keyword).info;
          local_a8._0_8_ = *(ulong *)(*(long *)((long)ppCVar2 + lVar5) + 0x28);
          local_a8.info = *(Info **)(*(long *)((long)ppCVar2 + lVar5) + 0x30);
          if (local_98.kind == local_a8.kind) {
            SVar6 = Token::range(&local_98);
            pDVar4 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x250005,SVar6);
            sVar7 = Token::valueText(&local_98);
            pDVar4 = Diagnostic::operator<<(pDVar4,sVar7);
            SVar6 = Token::range(&local_a8);
            bVar3 = true;
            Diagnostic::operator<<(pDVar4,SVar6);
          }
          else if ((local_a8.kind == FinalKeyword) && ((local_80 & 1) == 0)) {
            SVar6 = Token::range(&local_a8);
            bVar3 = true;
            pDVar4 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x5b0005,SVar6);
            local_80 = CONCAT71((int7)((ulong)pDVar4 >> 8),1);
          }
          else {
            bVar3 = false;
            if (((local_98.kind != FinalKeyword) && (local_a8.kind != FinalKeyword)) &&
               ((local_a8._0_8_ & 0x10000) == 0)) {
              SVar6 = Token::range(&local_98);
              pDVar4 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x80005,SVar6);
              sVar7 = Token::valueText(&local_98);
              pDVar4 = Diagnostic::operator<<(pDVar4,sVar7);
              SVar6 = Token::range(&local_a8);
              pDVar4 = Diagnostic::operator<<(pDVar4,SVar6);
              sVar7 = Token::valueText(&local_a8);
              bVar3 = true;
              Diagnostic::operator<<(pDVar4,sVar7);
            }
          }
        } while ((!bVar3) && (bVar3 = lVar1 + -8 != lVar5, lVar5 = lVar5 + 8, bVar3));
      }
    }
    SmallVectorBase<slang::syntax::ClassSpecifierSyntax*>::
    emplace_back<slang::syntax::ClassSpecifierSyntax*const&>
              ((SmallVectorBase<slang::syntax::ClassSpecifierSyntax*> *)local_70,&local_78);
  }
  sVar8._M_ptr._0_4_ =
       SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>::copy
                 (local_70,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  sVar8._M_ptr._4_4_ = extraout_var;
  if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
    operator_delete(local_70[0].data_);
  }
  sVar8._M_extent._M_extent_value = extraout_RDX._M_extent_value;
  return sVar8;
}

Assistant:

std::span<syntax::ClassSpecifierSyntax*> Parser::parseClassSpecifierList(bool allowSpecifiers) {
    bool erroredOnFinal = false;
    SmallVector<ClassSpecifierSyntax*> specifiers;
    while (peek(TokenKind::Colon)) {
        auto specifier = parseClassSpecifier();
        SLANG_ASSERT(specifier);

        if (!specifier->keyword.isMissing()) {
            if (specifiers.empty() && !allowSpecifiers)
                addDiag(diag::SpecifiersNotAllowed, specifier->sourceRange());

            for (auto other : specifiers) {
                const auto sk = specifier->keyword;
                const auto ok = other->keyword;

                if (sk.kind == ok.kind) {
                    addDiag(diag::DuplicateClassSpecifier, sk.range())
                        << sk.valueText() << ok.range();
                    break;
                }

                if (ok.kind == TokenKind::FinalKeyword && !erroredOnFinal) {
                    erroredOnFinal = true;
                    addDiag(diag::FinalSpecifierLast, ok.range());
                    break;
                }

                if (!ok.isMissing() && ok.kind != TokenKind::FinalKeyword &&
                    sk.kind != TokenKind::FinalKeyword) {
                    addDiag(diag::ClassSpecifierConflict, sk.range())
                        << sk.valueText() << ok.range() << ok.valueText();
                    break;
                }
            }
        }

        specifiers.push_back(specifier);
    }

    return specifiers.copy(alloc);
}